

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O2

Vec4 __thiscall
tcu::Texture2DArrayView::gatherOffsetsCompare
          (Texture2DArrayView *this,Sampler *sampler,float ref,float s,float t,float r,
          IVec2 (*offsets) [4])

{
  ConstPixelBufferAccess *src;
  int depth;
  IVec2 (*in_RCX) [4];
  Vec4 VVar1;
  
  src = *(ConstPixelBufferAccess **)&sampler->wrapR;
  depth = selectLayer((Texture2DArrayView *)sampler,r);
  VVar1 = gatherArray2DOffsetsCompare((tcu *)this,src,(Sampler *)offsets,ref,s,t,depth,in_RCX);
  return (Vec4)VVar1.m_data;
}

Assistant:

Vec4 Texture2DArrayView::gatherOffsetsCompare (const Sampler& sampler, float ref, float s, float t, float r, const IVec2 (&offsets)[4]) const
{
	return gatherArray2DOffsetsCompare(m_levels[0], sampler, ref, s, t, selectLayer(r), offsets);
}